

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandLutExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  Bmc_EsPar_t *pPars;
  int iVar6;
  char *pcVar7;
  Bmc_EsPar_t Pars;
  Bmc_EsPar_t local_78;
  
  local_78.nVars = 0;
  local_78.nNodes = 0;
  local_78.pTtStr = (char *)0x0;
  local_78.nLutSize = 2;
  local_78.nMajSupp = 0;
  local_78.fMajority = 0;
  local_78.fUseIncr = 0;
  local_78.fOnlyAnd = 0;
  local_78.fGlucose = 0;
  local_78.fOrderNodes = 0;
  local_78.fEnumSols = 0;
  local_78.fFewerVars = 0;
  local_78.RuntimeLim = 0;
  local_78._48_8_ = 1;
  Extra_UtilGetoptReset();
  pcVar7 = "Command line switch \"-T\" should be followed by an integer.\n";
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"INKTiaogvh"), uVar1 = local_78._0_8_,
          iVar6 = globalUtilOptind, 0x60 < iVar2) {
      if (iVar2 < 0x69) {
        if (iVar2 == 0x61) {
          local_78.fOnlyAnd = local_78.fOnlyAnd ^ 1;
        }
        else {
          if (iVar2 != 0x67) goto LAB_00256042;
          local_78.fGlucose = local_78.fGlucose ^ 1;
        }
      }
      else if (iVar2 == 0x69) {
        local_78.fUseIncr = local_78.fUseIncr ^ 1;
      }
      else if (iVar2 == 0x6f) {
        local_78.fFewerVars = local_78.fFewerVars ^ 1;
      }
      else {
        if (iVar2 != 0x76) goto LAB_00256042;
        local_78._48_8_ = local_78._48_8_ ^ 1;
      }
    }
    if (iVar2 < 0x4e) {
      if (iVar2 == 0x49) {
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-I\" should be followed by an integer.\n";
          goto LAB_00256033;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_78.nVars = uVar3;
      }
      else {
        if (iVar2 != 0x4b) {
          if (iVar2 == -1) {
            if (globalUtilOptind + 1 == argc) {
              local_78.pTtStr = argv[globalUtilOptind];
            }
            if (local_78.pTtStr != (char *)0x0) {
              iVar6 = local_78.nVars;
              uVar3 = 1 << ((char)local_78.nVars - 2U & 0x1f);
              sVar4 = strlen(local_78.pTtStr);
              if (uVar3 != (uint)sVar4) {
                Abc_Print(-1,"Truth table is expected to have %d hex digits (instead of %d).\n",
                          (ulong)uVar3,sVar4);
                return 1;
              }
              if (iVar6 <= (int)((local_78.nLutSize - 1U) * local_78.nNodes + 1)) {
                if (iVar6 < 0xb) {
                  if (local_78.nLutSize < 7) {
                    if (local_78.fGlucose == 0) {
                      Exa3_ManExactSynthesis2(&local_78);
                    }
                    else {
                      Exa3_ManExactSynthesis(&local_78);
                    }
                    return 0;
                  }
                  pcVar7 = "Node size should not be more than 6 inputs.\n";
                }
                else {
                  pcVar7 = "Function should not have more than 10 inputs.\n";
                }
                Abc_Print(-1,pcVar7);
                return 1;
              }
              Abc_Print(-1,
                        "Function with %d variales cannot be implemented with %d %d-input LUTs.\n",
                        uVar1 & 0xffffffff);
              return 1;
            }
            pcVar7 = "Truth table should be given on the command line.\n";
            iVar6 = -1;
            goto LAB_0025618b;
          }
          goto LAB_00256042;
        }
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-K\" should be followed by an integer.\n";
          goto LAB_00256033;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_78.nLutSize = uVar3;
      }
    }
    else if (iVar2 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_00256033;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_78.nNodes = uVar3;
    }
    else {
      if (iVar2 != 0x54) goto LAB_00256042;
      if (argc <= globalUtilOptind) {
LAB_00256033:
        Abc_Print(-1,pcVar7);
        goto LAB_00256042;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_78.RuntimeLim = uVar3;
    }
    globalUtilOptind = iVar6 + 1;
    if ((int)uVar3 < 0) {
LAB_00256042:
      Abc_Print(-2,"usage: lutexact [-INKT <num>] [-iaogvh] <hex>\n");
      Abc_Print(-2,"\t           exact synthesis of I-input function using N K-input gates\n");
      Abc_Print(-2,"\t-I <num> : the number of input variables [default = %d]\n",
                local_78._0_8_ & 0xffffffff);
      Abc_Print(-2,"\t-N <num> : the number of K-input nodes [default = %d]\n",
                (ulong)local_78._0_8_ >> 0x20);
      Abc_Print(-2,"\t-K <num> : the number of node fanins [default = %d]\n",
                (ulong)(uint)local_78.nLutSize);
      Abc_Print(-2,"\t-T <num> : the runtime limit in seconds [default = %d]\n",
                (ulong)(uint)local_78.RuntimeLim);
      pcVar5 = "yes";
      pcVar7 = "yes";
      if (local_78.fUseIncr == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-i       : toggle using incremental solving [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (local_78.fOnlyAnd == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (local_78.fFewerVars == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-o       : toggle using additional optimizations [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (local_78.fGlucose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,
                "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
                ,pcVar7);
      if (local_78.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      pcVar7 = "\t<hex>    : truth table in hex notation\n";
      iVar6 = -2;
LAB_0025618b:
      Abc_Print(iVar6,pcVar7);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandLutExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Exa3_ManExactSynthesis( Bmc_EsPar_t * pPars );
    extern void Exa3_ManExactSynthesis2( Bmc_EsPar_t * pPars );
    int c;
    Bmc_EsPar_t Pars, * pPars = &Pars;
    Bmc_EsParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "INKTiaogvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVars < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodes < 0 )
                goto usage;
            break;
       case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->RuntimeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->RuntimeLim < 0 )
                goto usage;
            break;
        case 'i':
            pPars->fUseIncr ^= 1;
            break;
        case 'a':
            pPars->fOnlyAnd ^= 1;
            break;
        case 'o':
            pPars->fFewerVars ^= 1;
            break;
        case 'g':
            pPars->fGlucose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
        pPars->pTtStr = argv[globalUtilOptind];
    if ( pPars->pTtStr == NULL )
    {
        Abc_Print( -1, "Truth table should be given on the command line.\n" );
        return 1;
    }
    if ( (1 << (pPars->nVars-2)) != (int)strlen(pPars->pTtStr) )
    {
        Abc_Print( -1, "Truth table is expected to have %d hex digits (instead of %d).\n", (1 << (pPars->nVars-2)), strlen(pPars->pTtStr) );
        return 1;
    }
    if ( pPars->nVars > pPars->nNodes * (pPars->nLutSize - 1) + 1 )
    {
        Abc_Print( -1, "Function with %d variales cannot be implemented with %d %d-input LUTs.\n", pPars->nVars, pPars->nNodes, pPars->nLutSize );
        return 1;
    }
    if ( pPars->nVars > 10 )
    {
        Abc_Print( -1, "Function should not have more than 10 inputs.\n" );
        return 1;
    }
    if ( pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Node size should not be more than 6 inputs.\n" );
        return 1;
    }
    if ( pPars->fGlucose )
        Exa3_ManExactSynthesis( pPars );
    else
        Exa3_ManExactSynthesis2( pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: lutexact [-INKT <num>] [-iaogvh] <hex>\n" );
    Abc_Print( -2, "\t           exact synthesis of I-input function using N K-input gates\n" );
    Abc_Print( -2, "\t-I <num> : the number of input variables [default = %d]\n", pPars->nVars );
    Abc_Print( -2, "\t-N <num> : the number of K-input nodes [default = %d]\n", pPars->nNodes );
    Abc_Print( -2, "\t-K <num> : the number of node fanins [default = %d]\n", pPars->nLutSize );
    Abc_Print( -2, "\t-T <num> : the runtime limit in seconds [default = %d]\n", pPars->RuntimeLim );
    Abc_Print( -2, "\t-i       : toggle using incremental solving [default = %s]\n", pPars->fUseIncr ? "yes" : "no" );
    Abc_Print( -2, "\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n", pPars->fOnlyAnd ? "yes" : "no" );
    Abc_Print( -2, "\t-o       : toggle using additional optimizations [default = %s]\n", pPars->fFewerVars ? "yes" : "no" );
    Abc_Print( -2, "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", pPars->fGlucose ? "yes" : "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", pPars->fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    Abc_Print( -2, "\t<hex>    : truth table in hex notation\n" );
    return 1;
}